

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

double Catch::Benchmark::Detail::anon_unknown_7::standard_deviation(double *first,double *last)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if (first == last) {
    dVar2 = NAN;
  }
  else {
    dVar3 = 0.0;
    pdVar1 = first;
    do {
      dVar3 = dVar3 + *pdVar1;
      pdVar1 = pdVar1 + 1;
    } while (pdVar1 != last);
    dVar4 = (double)((long)last - (long)first >> 3);
    dVar2 = 0.0;
    do {
      dVar5 = *first - dVar3 / dVar4;
      dVar2 = dVar2 + dVar5 * dVar5;
      first = first + 1;
    } while (first != last);
    dVar2 = dVar2 / dVar4;
  }
  if (0.0 <= dVar2) {
    return SQRT(dVar2);
  }
  dVar2 = sqrt(dVar2);
  return dVar2;
}

Assistant:

double mean( double const* first, double const* last ) {
                auto count = last - first;
                double sum = 0.;
                while (first != last) {
                    sum += *first;
                    ++first;
                }
                return sum / static_cast<double>(count);
            }